

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_mask_strong_bcs(REF_GRID ref_grid,REF_DICT ref_dict,REF_BOOL *replace,REF_INT ldim)

{
  REF_BOOL *pRVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  REF_CELL ref_cell;
  REF_BOOL *pRVar5;
  REF_STATUS RVar6;
  uint uVar7;
  REF_CELL *ppRVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_c4;
  REF_GRID local_c0;
  REF_BOOL *local_b8;
  REF_DICT local_b0;
  REF_INT local_a8 [30];
  
  pRVar3 = ref_grid->node;
  iVar10 = pRVar3->max;
  local_c0 = ref_grid;
  local_b8 = replace;
  local_b0 = ref_dict;
  if (0 < iVar10) {
    pRVar4 = pRVar3->global;
    uVar9 = 0;
    lVar11 = 0;
    do {
      if (-1 < pRVar4[lVar11] && 0 < ldim) {
        memset(local_b8 + uVar9,0,(ulong)(uint)ldim << 2);
        iVar10 = pRVar3->max;
      }
      lVar11 = lVar11 + 1;
      uVar9 = (ulong)(uint)((int)uVar9 + ldim);
    } while (lVar11 < iVar10);
  }
  pRVar5 = local_b8;
  ppRVar8 = local_c0->cell;
  if (local_c0->twod == 0) {
    ppRVar8 = local_c0->cell + 3;
  }
  ref_cell = *ppRVar8;
  if (0 < ref_cell->max) {
    uVar9 = 7;
    if (ldim % 6 != 0) {
      uVar9 = (ulong)((uint)(ldim * -0x33333333 + 0x19999999U < 0x33333333) * 5 + 1);
    }
    iVar10 = 0;
    do {
      RVar6 = ref_cell_nodes(ref_cell,iVar10,local_a8);
      if (RVar6 == 0) {
        local_c4 = -1;
        uVar7 = ref_dict_value(local_b0,local_a8[ref_cell->node_per],&local_c4);
        if ((uVar7 != 0) && (uVar7 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x17d,"ref_phys_mask_strong_bcs",(ulong)uVar7,"bc");
          local_c0 = (REF_GRID)CONCAT44(local_c0._4_4_,uVar7);
        }
        if ((uVar7 != 5) && (uVar7 != 0)) {
          return (REF_STATUS)local_c0;
        }
        if (0 < ref_cell->node_per) {
          lVar11 = 0;
          do {
            if (local_c4 == 4000) {
              iVar2 = local_a8[lVar11];
              pRVar1 = pRVar5 + uVar9 + (long)iVar2 * (long)ldim;
              *pRVar1 = 1;
              pRVar1[1] = 1;
              pRVar1[2] = 1;
              pRVar1[3] = 1;
              if (ldim % 6 == 0) {
                local_b8[(long)iVar2 * (long)ldim + 0xb] = 1;
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < ref_cell->node_per);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_mask_strong_bcs(REF_GRID ref_grid,
                                            REF_DICT ref_dict,
                                            REF_BOOL *replace, REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_INT first, last, i, node, bc;
  REF_INT nequ;

  nequ = 0;
  if (0 == ldim % 5) nequ = 5;
  if (0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = REF_FALSE;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node = nodes[cell_node];
      if (4000 == bc) {
        first = nequ + 1; /* first momentum */
        last = nequ + 4;  /* energy */
        for (i = first; i <= last; i++) replace[i + ldim * node] = REF_TRUE;
        if (6 == nequ) replace[nequ + 5 + ldim * node] = REF_TRUE; /* turb */
      }
    }
  }

  return REF_SUCCESS;
}